

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

void usage(char *cmd,char *msg,...)

{
  FILE *pFVar1;
  char in_AL;
  bool bVar2;
  undefined8 uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  char *in_R8;
  undefined8 in_R9;
  char *in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  iterator iter;
  va_list args;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
  *in_stack_fffffffffffffea8;
  undefined1 local_128 [8];
  allocator<char> *in_stack_fffffffffffffee0;
  int line;
  char *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  LogLevel level;
  _Self local_70 [3];
  allocator<char> local_51;
  string local_50 [32];
  _Self local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined8 local_8;
  
  line = (int)((ulong)in_R9 >> 0x20);
  level = (LogLevel)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff08 = in_XMM0_Qa;
    level = (LogLevel)((ulong)in_XMM0_Qb >> 0x20);
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RSI != (char *)0x0) {
    local_18 = local_128;
    local_20 = &stack0x00000008;
    local_24 = 0x30;
    local_28 = 0x10;
    fprintf(_stderr,"imgtool %s: ",in_RDI);
    vfprintf(_stderr,local_10,&local_28);
    fprintf(_stderr,"\n\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RCX,in_RDX,in_stack_fffffffffffffee0);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
       ::find(in_stack_fffffffffffffea8,(key_type *)0x3d25bd);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
       ::end(in_stack_fffffffffffffea8);
  bVar2 = std::operator!=(&local_30,local_70);
  pFVar1 = _stderr;
  if (!bVar2) {
    pbrt::LogFatal<char_const(&)[27]>
              (level,in_stack_ffffffffffffff08,line,in_R8,(char (*) [27])in_RCX);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
                *)0x3d26a1);
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"usage: imgtool %s\n\n",uVar3);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
                *)0x3d26d0);
  uVar4 = std::__cxx11::string::empty();
  pFVar1 = _stderr;
  if ((uVar4 & 1) == 0) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
                  *)0x3d2700);
    uVar3 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"options:%s\n",uVar3);
  }
  exit(1);
}

Assistant:

static void usage(const char *cmd, const char *msg = nullptr, ...) {
    if (msg != nullptr) {
        va_list args;
        va_start(args, msg);
        fprintf(stderr, "imgtool %s: ", cmd);
        vfprintf(stderr, msg, args);
        fprintf(stderr, "\n\n");
    }

    auto iter = commandUsage.find(cmd);
    CHECK(iter != commandUsage.end());
    fprintf(stderr, "usage: imgtool %s\n\n", iter->second.usage.c_str());
    if (!iter->second.options.empty())
        fprintf(stderr, "options:%s\n", iter->second.options.c_str());

    exit(1);
}